

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O0

BOOL IsInDebugBreak(void *addr)

{
  bool local_11;
  void *addr_local;
  
  local_11 = &RtlRestoreContext_End < addr && addr < (void *)0x3d322b;
  return (BOOL)local_11;
}

Assistant:

BOOL
IsInDebugBreak(void *addr)
{
#ifdef _M_IX86
    // TODO: enable this
    // When enabled, lldb/ch fails prematurely at initialization phase
    return FALSE;
#else
    return (addr >= (void *)DBG_DebugBreak) && (addr <= (void *)DBG_DebugBreak_End);
#endif
}